

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::DescriptorProto::_InternalParse(DescriptorProto *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  char *size;
  Rep *pRVar3;
  internal *piVar4;
  bool bVar5;
  DescriptorProto_ExtensionRange *msg;
  DescriptorProto *msg_00;
  EnumDescriptorProto *msg_01;
  OneofDescriptorProto *msg_02;
  FieldDescriptorProto *pFVar6;
  MessageOptions *pMVar7;
  DescriptorProto_ReservedRange *msg_03;
  char cVar8;
  uint uVar9;
  char *pcVar10;
  string **field_name;
  Arena *pAVar11;
  UnknownFieldSet *unknown;
  byte *pbVar12;
  char cVar13;
  uint res;
  string *psVar14;
  pair<const_char_*,_unsigned_int> pVar15;
  StringPiece str;
  StringPiece str_00;
  string *local_98;
  RepeatedPtrFieldBase *local_90;
  RepeatedPtrFieldBase *local_88;
  RepeatedPtrFieldBase *local_80;
  RepeatedPtrFieldBase *local_78;
  RepeatedPtrFieldBase *local_70;
  RepeatedPtrFieldBase *local_68;
  RepeatedPtrFieldBase *local_60;
  int *local_58;
  RepeatedPtrFieldBase *local_50;
  ArenaStringPtr *local_48;
  InternalMetadata *local_40;
  byte *local_38;
  char *ptr_local;
  
  local_40 = &(this->super_Message).super_MessageLite._internal_metadata_;
  local_50 = &(this->reserved_name_).super_RepeatedPtrFieldBase;
  local_58 = &(this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  local_90 = &(this->reserved_range_).super_RepeatedPtrFieldBase;
  local_88 = &(this->oneof_decl_).super_RepeatedPtrFieldBase;
  local_80 = &(this->extension_).super_RepeatedPtrFieldBase;
  local_78 = &(this->extension_range_).super_RepeatedPtrFieldBase;
  local_70 = &(this->enum_type_).super_RepeatedPtrFieldBase;
  local_68 = &(this->nested_type_).super_RepeatedPtrFieldBase;
  local_60 = &(this->field_).super_RepeatedPtrFieldBase;
  local_48 = &this->name_;
  local_38 = (byte *)ptr;
  do {
    bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar5) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    pbVar12 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar12 * 0x80) - 0x80;
      if ((char)*pbVar12 < '\0') {
        pVar15 = internal::ReadTagFallback((char *)local_38,res);
        pbVar12 = (byte *)pVar15.first;
        res = pVar15.second;
      }
      else {
        pbVar12 = local_38 + 2;
      }
    }
    local_38 = pbVar12;
    if (pbVar12 == (byte *)0x0) {
LAB_0029b2bd:
      cVar8 = '\x04';
      goto LAB_0029b2b2;
    }
    uVar9 = (res >> 3) - 1;
    if (uVar9 < 10) {
      pcVar10 = (char *)((long)&switchD_0029ab58::switchdataD_003553d0 +
                        (long)(int)(&switchD_0029ab58::switchdataD_003553d0)[uVar9]);
      cVar13 = (char)res;
      switch(res >> 3) {
      case 1:
        if (cVar13 != '\n') goto switchD_0029ab58_default;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar11 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar11 & 1) != 0) {
          pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
        }
        if (local_48->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (local_48,pAVar11,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar14 = local_48->ptr_;
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar14,(char *)local_38,ctx);
        piVar4 = (internal *)(psVar14->_M_dataplus)._M_p;
        size = (char *)psVar14->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        str.length_ = (stringpiece_ssize_type)"google.protobuf.DescriptorProto.name";
        str.ptr_ = size;
        internal::VerifyUTF8(piVar4,str,pcVar10);
        cVar8 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
        break;
      case 2:
        if (cVar13 != '\x12') goto switchD_0029ab58_default;
        local_38 = pbVar12 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar3 = (this->field_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0029afdb:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_60,(this->field_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0029afea:
            pRVar3 = (this->field_).super_RepeatedPtrFieldBase.rep_;
            pRVar3->allocated_size = pRVar3->allocated_size + 1;
            pFVar6 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                               ((this->field_).super_RepeatedPtrFieldBase.arena_);
            pRVar3 = (this->field_).super_RepeatedPtrFieldBase.rep_;
            iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
            (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pRVar3->elements[iVar2] = pFVar6;
          }
          else {
            iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) {
              if (pRVar3->allocated_size == (this->field_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0029afdb;
              goto LAB_0029afea;
            }
            (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pFVar6 = (FieldDescriptorProto *)pRVar3->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::FieldDescriptorProto>
                                       (ctx,pFVar6,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_0029b2bd;
          cVar8 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x12));
        break;
      case 3:
        if (cVar13 != '\x1a') goto switchD_0029ab58_default;
        local_38 = pbVar12 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0029adb6:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_68,(this->nested_type_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0029adc5:
            pRVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
            pRVar3->allocated_size = pRVar3->allocated_size + 1;
            msg_00 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                               ((this->nested_type_).super_RepeatedPtrFieldBase.arena_);
            pRVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
            iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
            (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pRVar3->elements[iVar2] = msg_00;
          }
          else {
            iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) {
              if (pRVar3->allocated_size ==
                  (this->nested_type_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0029adb6;
              goto LAB_0029adc5;
            }
            (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg_00 = (DescriptorProto *)pRVar3->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                                       (ctx,msg_00,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_0029b2bd;
          cVar8 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x1a));
        break;
      case 4:
        if (cVar13 != '\"') goto switchD_0029ab58_default;
        local_38 = pbVar12 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0029ae62:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_70,(this->enum_type_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0029ae71:
            pRVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
            pRVar3->allocated_size = pRVar3->allocated_size + 1;
            msg_01 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                               ((this->enum_type_).super_RepeatedPtrFieldBase.arena_);
            pRVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
            iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
            (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pRVar3->elements[iVar2] = msg_01;
          }
          else {
            iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) {
              if (pRVar3->allocated_size ==
                  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0029ae62;
              goto LAB_0029ae71;
            }
            (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg_01 = (EnumDescriptorProto *)pRVar3->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::EnumDescriptorProto>
                                       (ctx,msg_01,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_0029b2bd;
          cVar8 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x22));
        break;
      case 5:
        if (cVar13 != '*') goto switchD_0029ab58_default;
        local_38 = pbVar12 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0029ac0e:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_78,(this->extension_range_).super_RepeatedPtrFieldBase.total_size_ + 1)
            ;
LAB_0029ac1d:
            pRVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
            pRVar3->allocated_size = pRVar3->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
                            ((this->extension_range_).super_RepeatedPtrFieldBase.arena_);
            pRVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
            iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
            (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pRVar3->elements[iVar2] = msg;
          }
          else {
            iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) {
              if (pRVar3->allocated_size ==
                  (this->extension_range_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0029ac0e;
              goto LAB_0029ac1d;
            }
            (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (DescriptorProto_ExtensionRange *)pRVar3->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::DescriptorProto_ExtensionRange>
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_0029b2bd;
          cVar8 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x2a));
        break;
      case 6:
        if (cVar13 != '2') goto switchD_0029ab58_default;
        local_38 = pbVar12 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar3 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0029b08a:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_80,(this->extension_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0029b09c:
            pRVar3 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
            pRVar3->allocated_size = pRVar3->allocated_size + 1;
            pFVar6 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                               ((this->extension_).super_RepeatedPtrFieldBase.arena_);
            pRVar3 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
            iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
            (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pRVar3->elements[iVar2] = pFVar6;
          }
          else {
            iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) {
              if (pRVar3->allocated_size ==
                  (this->extension_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0029b08a;
              goto LAB_0029b09c;
            }
            (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pFVar6 = (FieldDescriptorProto *)pRVar3->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::FieldDescriptorProto>
                                       (ctx,pFVar6,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_0029b2bd;
          cVar8 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x32));
        break;
      case 7:
        if (cVar13 != ':') goto switchD_0029ab58_default;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if (this->options_ == (MessageOptions *)0x0) {
          pAVar11 = (Arena *)local_40->ptr_;
          if (((ulong)pAVar11 & 1) != 0) {
            pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
          }
          pMVar7 = Arena::CreateMaybeMessage<google::protobuf::MessageOptions>(pAVar11);
          this->options_ = pMVar7;
        }
        local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::MessageOptions>
                                     (ctx,this->options_,(char *)local_38);
        goto LAB_0029b29f;
      case 8:
        if (cVar13 != 'B') goto switchD_0029ab58_default;
        local_38 = pbVar12 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar3 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0029af11:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_88,(this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0029af23:
            pRVar3 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
            pRVar3->allocated_size = pRVar3->allocated_size + 1;
            msg_02 = Arena::CreateMaybeMessage<google::protobuf::OneofDescriptorProto>
                               ((this->oneof_decl_).super_RepeatedPtrFieldBase.arena_);
            pRVar3 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
            iVar2 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
            (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pRVar3->elements[iVar2] = msg_02;
          }
          else {
            iVar2 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) {
              if (pRVar3->allocated_size ==
                  (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0029af11;
              goto LAB_0029af23;
            }
            (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg_02 = (OneofDescriptorProto *)pRVar3->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::OneofDescriptorProto>
                                       (ctx,msg_02,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_0029b2bd;
          cVar8 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x42));
        break;
      case 9:
        if (cVar13 != 'J') goto switchD_0029ab58_default;
        local_38 = pbVar12 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0029b1a2:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_90,(this->reserved_range_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0029b1b7:
            pRVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
            pRVar3->allocated_size = pRVar3->allocated_size + 1;
            msg_03 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ReservedRange>
                               ((this->reserved_range_).super_RepeatedPtrFieldBase.arena_);
            pRVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
            iVar2 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
            (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            pRVar3->elements[iVar2] = msg_03;
          }
          else {
            iVar2 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) {
              if (pRVar3->allocated_size ==
                  (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0029b1a2;
              goto LAB_0029b1b7;
            }
            (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg_03 = (DescriptorProto_ReservedRange *)pRVar3->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::DescriptorProto_ReservedRange>
                                       (ctx,msg_03,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_0029b2bd;
          cVar8 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x4a));
        break;
      case 10:
        if (cVar13 != 'R') goto switchD_0029ab58_default;
        local_38 = pbVar12 + -1;
        do {
          local_38 = local_38 + 1;
          pRVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0029ad5c:
            internal::RepeatedPtrFieldBase::Reserve
                      (local_50,(this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0029ad6e:
            field_name = &local_98;
            _InternalParse();
            psVar14 = local_98;
          }
          else {
            iVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
            field_name = (string **)(long)iVar2;
            if (pRVar3->allocated_size <= iVar2) {
              if (pRVar3->allocated_size ==
                  (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0029ad5c;
              goto LAB_0029ad6e;
            }
            (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            psVar14 = (string *)pRVar3->elements[(long)field_name];
          }
          local_38 = (byte *)internal::InlineGreedyStringParser(psVar14,(char *)local_38,ctx);
          piVar4 = (internal *)(psVar14->_M_dataplus)._M_p;
          pcVar10 = (char *)psVar14->_M_string_length;
          if ((long)pcVar10 < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)pcVar10,"size_t to int conversion");
          }
          str_00.length_ = (stringpiece_ssize_type)"google.protobuf.DescriptorProto.reserved_name";
          str_00.ptr_ = pcVar10;
          internal::VerifyUTF8(piVar4,str_00,(char *)field_name);
          if (local_38 == (byte *)0x0) {
            cVar13 = '\x04';
          }
          else {
            cVar13 = '\x15';
            if (local_38 < (ctx->super_EpsCopyInputStream).limit_end_) {
              cVar13 = '\0';
            }
          }
          cVar8 = '\x02';
          if (cVar13 != '\0') {
            if (cVar13 != '\x15') {
              cVar8 = cVar13;
            }
            break;
          }
        } while (*local_38 == 0x52);
      }
    }
    else {
switchD_0029ab58_default:
      if (res == 0 || (res & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        cVar8 = '\x17';
      }
      else {
        if (((ulong)local_40->ptr_ & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_40);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)local_40->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
LAB_0029b29f:
        cVar8 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_0029b2b2:
    if (cVar8 != '\x02') {
      if (cVar8 == '\x04') {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* DescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.DescriptorProto.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_field(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nested_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MessageOptions options = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_oneof_decl(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_reserved_name();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            #ifndef NDEBUG
            ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.DescriptorProto.reserved_name");
            #endif  // !NDEBUG
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}